

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPListener.cpp
# Opt level: O0

void __thiscall TCPListener::start(TCPListener *this,Address address,int backlogLength)

{
  int iVar1;
  TCPListenerError *pTVar2;
  int *piVar3;
  allocator local_109;
  string local_108 [38];
  undefined1 local_e2;
  allocator local_e1;
  string local_e0 [32];
  int local_c0;
  undefined1 local_ba;
  allocator local_b9;
  int x_2;
  int local_98;
  int local_94;
  int x_1;
  int status;
  int enable;
  int local_64;
  undefined1 local_5d;
  int x;
  allocator local_49;
  string local_48 [36];
  int local_24;
  TCPListener *pTStack_20;
  int backlogLength_local;
  TCPListener *this_local;
  Address address_local;
  
  address_local._0_8_ = address.sin_zero;
  this_local = address._0_8_;
  local_24 = backlogLength;
  pTStack_20 = this;
  if (backlogLength < 1) {
    local_5d = 1;
    pTVar2 = (TCPListenerError *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"TCPListener\'s queue cannot be shorter than 1",&local_49)
    ;
    TCPListenerError::TCPListenerError(pTVar2,(string *)local_48,0);
    local_5d = 0;
    __cxa_throw(pTVar2,&TCPListenerError::typeinfo,TCPListenerError::~TCPListenerError);
  }
  this->backlogLength = backlogLength;
  if ((this->listening & 1U) != 0) {
    pTVar2 = (TCPListenerError *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"TCPListener is already listening",&local_109);
    TCPListenerError::TCPListenerError(pTVar2,(string *)local_108,0);
    __cxa_throw(pTVar2,&TCPListenerError::typeinfo,TCPListenerError::~TCPListenerError);
  }
  iVar1 = bind((this->super_Socket).socketDescriptor,(sockaddr *)&this_local,0x10);
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    local_64 = *piVar3;
    status._2_1_ = 1;
    pTVar2 = (TCPListenerError *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&enable,"Could not bind",(allocator *)((long)&status + 3));
    TCPListenerError::TCPListenerError(pTVar2,(string *)&enable,local_64);
    status._2_1_ = 0;
    __cxa_throw(pTVar2,&TCPListenerError::typeinfo,TCPListenerError::~TCPListenerError);
  }
  x_1 = 1;
  local_94 = setsockopt((this->super_Socket).socketDescriptor,1,2,&x_1,4);
  if (local_94 < 0) {
    piVar3 = __errno_location();
    local_98 = *piVar3;
    local_ba = 1;
    pTVar2 = (TCPListenerError *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&x_2,"Could not setup address reusing for TCPListener",&local_b9);
    TCPListenerError::TCPListenerError(pTVar2,(string *)&x_2,local_98);
    local_ba = 0;
    __cxa_throw(pTVar2,&TCPListenerError::typeinfo,TCPListenerError::~TCPListenerError);
  }
  iVar1 = listen((this->super_Socket).socketDescriptor,local_24);
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    local_c0 = *piVar3;
    local_e2 = 1;
    pTVar2 = (TCPListenerError *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"Could not start listening",&local_e1);
    TCPListenerError::TCPListenerError(pTVar2,(string *)local_e0,local_c0);
    local_e2 = 0;
    __cxa_throw(pTVar2,&TCPListenerError::typeinfo,TCPListenerError::~TCPListenerError);
  }
  this->listening = true;
  return;
}

Assistant:

void TCPListener::start(Address address, int backlogLength)
{
    if(backlogLength < 1){
        throw TCPListenerError("TCPListener's queue cannot be shorter than 1");
    }
    this->backlogLength = backlogLength;

    if(!listening)
    {
        if(::bind(socketDescriptor, (sockaddr*)&address, sizeof(address)) < 0)
        {
            int x = errno;
            throw TCPListenerError("Could not bind", x);
        }

        int enable = 1;
        int status = setsockopt(socketDescriptor, SOL_SOCKET, SO_REUSEADDR, &enable, sizeof(int));
        if (status < 0){
            int x = errno;
            throw TCPListenerError("Could not setup address reusing for TCPListener", x);
        }

        if(::listen(socketDescriptor, backlogLength) < 0)
        {
            int x = errno;
            throw TCPListenerError("Could not start listening", x);
        }

        listening = true;
    }
    else
    {
        throw TCPListenerError("TCPListener is already listening");
    }
}